

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

Fl_Double_Window * make_global_settings_window(void)

{
  Fl_Boxtype FVar1;
  Fl_Widget *pFVar2;
  Fl_Group *pFVar3;
  Fl_Button *pFVar4;
  Fl_Button *o_5;
  Fl_Button *o_4;
  Fl_Group *o_3;
  Fl_Group *o_2;
  Fl_Group *o_1;
  Fl_Group *o;
  
  pFVar2 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar2,400,0x17a,"FLTK Preferences");
  global_settings_window = (Fl_Double_Window *)pFVar2;
  Fl_Widget::color(pFVar2,0x32);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,10,0x17c,100,"Keyboard Focus Options");
  FVar1 = fl_define_FL_GTK_UP_BOX();
  Fl_Widget::box((Fl_Widget *)pFVar3,FVar1 + FL_FLAT_BOX);
  Fl_Widget::labelfont((Fl_Widget *)pFVar3,2);
  Fl_Widget::align((Fl_Widget *)pFVar3,0x15);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,0xf5,0x28,100,0x19,"Visible Keyboard Focus:");
  wVisibleFocus = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "OPTION_VISIBLE_FOCUS\n\nIf visible focus is switched on, FLTK will draw a dotted rectangle inside the widget that will receive the next keystroke. If switched off, no such indicator will be drawn and keyboard navigation is disabled.\n\nDefault is on."
                    );
  Fl_Menu_::down_box(&wVisibleFocus->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wVisibleFocus,cb_wVisibleFocus);
  Fl_Menu_::menu(&wVisibleFocus->super_Fl_Menu_,menu_wVisibleFocus);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,0xf5,0x4b,100,0x19,"Arrow Keys move Focus:");
  wArrowFocus = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "OPTION_ARROW_FOCUS\n\nWhen switched on, moving the text cursor beyond the start or end of the text in a text widget will change focus to the next widget. When switched off, the cursor will stop at the end of the text. Pressing Tab or Ctrl-Tab will advance the keyboard focus. Switch this on, if you want the old behavior of FLTK 1.1.\n\nDefault is off."
                    );
  Fl_Menu_::down_box(&wArrowFocus->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wArrowFocus,cb_wArrowFocus);
  Fl_Menu_::menu(&wArrowFocus->super_Fl_Menu_,menu_wArrowFocus);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x78,0x17c,0x41,"Tooltip Options");
  FVar1 = fl_define_FL_GTK_UP_BOX();
  Fl_Widget::box((Fl_Widget *)pFVar3,FVar1 + FL_FLAT_BOX);
  Fl_Widget::labelfont((Fl_Widget *)pFVar3,2);
  Fl_Widget::align((Fl_Widget *)pFVar3,0x15);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,0xf5,0x96,100,0x19,"Show Tooltips:");
  wShowTooltips = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "OPTION_SHOW_TOOLTIPS\n\nIf tooltips are enabled, hovering the mouse over a widget with a tooltip text will open a little tooltip window until the mouse leaves the widget. If disabled, no tooltip is shown.\n\nDefault is on."
                    );
  Fl_Menu_::down_box(&wShowTooltips->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wShowTooltips,cb_wShowTooltips);
  Fl_Menu_::menu(&wShowTooltips->super_Fl_Menu_,menu_wShowTooltips);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0xc2,0x17c,0x42,"Drag And Drop Options");
  FVar1 = fl_define_FL_GTK_UP_BOX();
  Fl_Widget::box((Fl_Widget *)pFVar3,FVar1 + FL_FLAT_BOX);
  Fl_Widget::labelfont((Fl_Widget *)pFVar3,2);
  Fl_Widget::align((Fl_Widget *)pFVar3,0x15);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,0xf5,0xe1,100,0x19,"Allow dragging Text:");
  wDNDText = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "OPTION_DND_TEXT\n\nIf text drag-and-drop is enabled, the user can select and drag text from any text widget. If disabled, no dragging is possible, however dropping text from other applications still works.\n\nDefault is on."
                    );
  Fl_Menu_::down_box(&wDNDText->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wDNDText,cb_wDNDText);
  Fl_Menu_::menu(&wDNDText->super_Fl_Menu_,menu_wDNDText);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x10d,0x17c,0x42,"Native File Chooser Options");
  FVar1 = fl_define_FL_GTK_UP_BOX();
  Fl_Widget::box((Fl_Widget *)pFVar3,FVar1 + FL_FLAT_BOX);
  Fl_Widget::labelfont((Fl_Widget *)pFVar3,2);
  Fl_Widget::align((Fl_Widget *)pFVar3,0x15);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,0xf5,300,100,0x19,"Native File Chooser uses GTK:");
  wGTKText = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "OPTION_FNFC_USES_GTK\n        \nIf \'Native File Chooser uses GTK\' is enabled, the Fl_Native_File_Chooser class\ncalls the GTK open/save file dialogs when they are available on the platfom. If disabled, the Fl_Native_File_Chooser class\nalways uses FLTK\'s own file dialog (i.e., Fl_File_Chooser) even if GTK is available.\n\nDefault is on."
                    );
  Fl_Menu_::down_box(&wGTKText->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wGTKText,cb_wGTKText);
  Fl_Menu_::menu(&wGTKText->super_Fl_Menu_,menu_wGTKText);
  Fl_Group::end(pFVar3);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,10,0x159,0x8d,0x19,(char *)0x0);
  wUserOrSystem = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,
                     "Change settings for the current user, or default values for all users of this computer. Individual users can override system options, if they set their options to specific values (not \'default\')."
                    );
  Fl_Menu_::down_box(&wUserOrSystem->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)wUserOrSystem,cb_wUserOrSystem);
  Fl_Menu_::menu(&wUserOrSystem->super_Fl_Menu_,menu_wUserOrSystem);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar4,0xe6,0x159,0x4b,0x19,"Cancel");
  Fl_Widget::callback((Fl_Widget *)pFVar4,cb_Cancel1);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar4,0x13b,0x159,0x4b,0x19,"OK");
  Fl_Widget::callback((Fl_Widget *)pFVar4,cb_OK);
  Fl_Group::end((Fl_Group *)global_settings_window);
  readPrefs();
  Fl::option(OPTION_SHOW_TOOLTIPS,true);
  return global_settings_window;
}

Assistant:

Fl_Double_Window* make_global_settings_window() {
  { global_settings_window = new Fl_Double_Window(400, 378, "FLTK Preferences");
    global_settings_window->color(FL_LIGHT1);
    { Fl_Group* o = new Fl_Group(10, 10, 380, 100, "Keyboard Focus Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wVisibleFocus = new Fl_Choice(245, 40, 100, 25, "Visible Keyboard Focus:");
        wVisibleFocus->tooltip("OPTION_VISIBLE_FOCUS\n\nIf visible focus is switched on, FLTK will draw a dot\
ted rectangle inside the widget that will receive the next keystroke. If switc\
hed off, no such indicator will be drawn and keyboard navigation is disabled.\
\n\nDefault is on.");
        wVisibleFocus->down_box(FL_BORDER_BOX);
        wVisibleFocus->callback((Fl_Callback*)cb_wVisibleFocus);
        wVisibleFocus->menu(menu_wVisibleFocus);
      } // Fl_Choice* wVisibleFocus
      { wArrowFocus = new Fl_Choice(245, 75, 100, 25, "Arrow Keys move Focus:");
        wArrowFocus->tooltip("OPTION_ARROW_FOCUS\n\nWhen switched on, moving the text cursor beyond the sta\
rt or end of the text in a text widget will change focus to the next widget. W\
hen switched off, the cursor will stop at the end of the text. Pressing Tab or\
 Ctrl-Tab will advance the keyboard focus. Switch this on, if you want the old\
 behavior of FLTK 1.1.\n\nDefault is off.");
        wArrowFocus->down_box(FL_BORDER_BOX);
        wArrowFocus->callback((Fl_Callback*)cb_wArrowFocus);
        wArrowFocus->menu(menu_wArrowFocus);
      } // Fl_Choice* wArrowFocus
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 120, 380, 65, "Tooltip Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wShowTooltips = new Fl_Choice(245, 150, 100, 25, "Show Tooltips:");
        wShowTooltips->tooltip("OPTION_SHOW_TOOLTIPS\n\nIf tooltips are enabled, hovering the mouse over a wi\
dget with a tooltip text will open a little tooltip window until the mouse lea\
ves the widget. If disabled, no tooltip is shown.\n\nDefault is on.");
        wShowTooltips->down_box(FL_BORDER_BOX);
        wShowTooltips->callback((Fl_Callback*)cb_wShowTooltips);
        wShowTooltips->menu(menu_wShowTooltips);
      } // Fl_Choice* wShowTooltips
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 194, 380, 66, "Drag And Drop Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wDNDText = new Fl_Choice(245, 225, 100, 25, "Allow dragging Text:");
        wDNDText->tooltip("OPTION_DND_TEXT\n\nIf text drag-and-drop is enabled, the user can select and \
drag text from any text widget. If disabled, no dragging is possible, however \
dropping text from other applications still works.\n\nDefault is on.");
        wDNDText->down_box(FL_BORDER_BOX);
        wDNDText->callback((Fl_Callback*)cb_wDNDText);
        wDNDText->menu(menu_wDNDText);
      } // Fl_Choice* wDNDText
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 269, 380, 66, "Native File Chooser Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wGTKText = new Fl_Choice(245, 300, 100, 25, "Native File Chooser uses GTK:");
        wGTKText->tooltip("OPTION_FNFC_USES_GTK\n        \nIf \'Native File Chooser uses GTK\' is enable\
d, the Fl_Native_File_Chooser class\ncalls the GTK open/save file dialogs when\
 they are available on the platfom. If disabled, the Fl_Native_File_Chooser cl\
ass\nalways uses FLTK\'s own file dialog (i.e., Fl_File_Chooser) even if GTK i\
s available.\n\nDefault is on.");
        wGTKText->down_box(FL_BORDER_BOX);
        wGTKText->callback((Fl_Callback*)cb_wGTKText);
        wGTKText->menu(menu_wGTKText);
      } // Fl_Choice* wGTKText
      o->end();
    } // Fl_Group* o
    { wUserOrSystem = new Fl_Choice(10, 345, 141, 25);
      wUserOrSystem->tooltip("Change settings for the current user, or default values for all users of this\
 computer. Individual users can override system options, if they set their opt\
ions to specific values (not \'default\').");
      wUserOrSystem->down_box(FL_BORDER_BOX);
      wUserOrSystem->callback((Fl_Callback*)cb_wUserOrSystem);
      wUserOrSystem->menu(menu_wUserOrSystem);
    } // Fl_Choice* wUserOrSystem
    { Fl_Button* o = new Fl_Button(230, 345, 75, 25, "Cancel");
      o->callback((Fl_Callback*)cb_Cancel1);
    } // Fl_Button* o
    { Fl_Button* o = new Fl_Button(315, 345, 75, 25, "OK");
      o->callback((Fl_Callback*)cb_OK);
    } // Fl_Button* o
    global_settings_window->end();
  } // Fl_Double_Window* global_settings_window
  readPrefs();
    Fl::option(Fl::OPTION_SHOW_TOOLTIPS,1); // make sure tooltips are on !
  return global_settings_window;
}